

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::
ReadPropertyWithExplicitDefault<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *ret,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *default_value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined6 in_register_00000032;
  ParquetEncryptionConfig *__tmp;
  _Alloc_hider local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  iVar6 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar6 != '\0') {
    iVar6 = (*this->_vptr_Deserializer[10])(this);
    if ((char)iVar6 == '\0') {
      local_30._M_p = (pointer)0x0;
      local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (*this->_vptr_Deserializer[6])(this);
      ParquetEncryptionConfig::Deserialize((ParquetEncryptionConfig *)&stack0xffffffffffffffd0,this)
      ;
      (*this->_vptr_Deserializer[7])(this);
    }
    (*this->_vptr_Deserializer[0xb])(this);
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_30._M_p;
    p_Var1 = (ret->internal).
             super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_28;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  uVar2 = *(undefined4 *)
           &(default_value->internal).
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(default_value->internal).
                   super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4);
  uVar4 = *(undefined4 *)
           &(default_value->internal).
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(default_value->internal).
                   super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 4);
  (default_value->internal).
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (default_value->internal).
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (ret->internal).
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  *(undefined4 *)
   &(ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(ret->internal).
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
   4) = uVar3;
  *(undefined4 *)
   &(ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar4;
  *(undefined4 *)
   ((long)&(ret->internal).
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T &ret, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(default_value);
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}